

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window_rownumber_function.cpp
# Opt level: O1

void __thiscall
duckdb::WindowRowNumberExecutor::WindowRowNumberExecutor
          (WindowRowNumberExecutor *this,BoundWindowExpression *wexpr,ClientContext *context,
          WindowSharedExpressions *shared)

{
  pointer pBVar1;
  iterator __position;
  column_t in_RAX;
  BoundOrderByNode *order;
  pointer pBVar2;
  column_t local_38;
  
  local_38 = in_RAX;
  WindowExecutor::WindowExecutor(&this->super_WindowExecutor,wexpr,context,shared);
  (this->super_WindowExecutor)._vptr_WindowExecutor =
       (_func_int **)&PTR__WindowRowNumberExecutor_024b51b8;
  this->ntile_idx = 0xffffffffffffffff;
  (this->arg_order_idx).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->arg_order_idx).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->arg_order_idx).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  pBVar2 = (wexpr->arg_orders).
           super_vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>.
           super__Vector_base<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pBVar1 = (wexpr->arg_orders).
           super_vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>.
           super__Vector_base<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  if (pBVar2 != pBVar1) {
    do {
      local_38 = WindowSharedExpressions::RegisterExpr(&pBVar2->expression,&shared->sink_shared);
      __position._M_current =
           (this->arg_order_idx).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (this->arg_order_idx).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::
        _M_realloc_insert<unsigned_long>
                  ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&this->arg_order_idx,
                   __position,&local_38);
      }
      else {
        *__position._M_current = local_38;
        (this->arg_order_idx).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_finish = __position._M_current + 1;
      }
      pBVar2 = pBVar2 + 1;
    } while (pBVar2 != pBVar1);
  }
  return;
}

Assistant:

WindowRowNumberExecutor::WindowRowNumberExecutor(BoundWindowExpression &wexpr, ClientContext &context,
                                                 WindowSharedExpressions &shared)
    : WindowExecutor(wexpr, context, shared) {

	for (const auto &order : wexpr.arg_orders) {
		arg_order_idx.emplace_back(shared.RegisterSink(order.expression));
	}
}